

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

string * __thiscall
cmCTestGIT::FindTopDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  bool bVar1;
  ulong uVar2;
  string local_120;
  undefined1 local_100 [8];
  OutputLogger rev_parse_err;
  undefined1 local_b0 [8];
  OneLineParser rev_parse_out;
  string cdup;
  char *git_rev_parse [4];
  char *git;
  cmCTestGIT *this_local;
  string *top_dir;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  cdup.field_2._8_8_ = std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)&rev_parse_out.Line1);
  OneLineParser::OneLineParser
            ((OneLineParser *)local_b0,this,"rev-parse-out> ",(string *)&rev_parse_out.Line1);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_100,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "rev-parse-err> ");
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,(char **)((long)&cdup.field_2 + 8),
                              (OutputParser *)local_b0,(OutputParser *)local_100,(char *)0x0,UTF8);
  if ((bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&rev_parse_out.Line1);
    cmsys::SystemTools::CollapseFullPath(&local_120,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_100);
  OneLineParser::~OneLineParser((OneLineParser *)local_b0);
  std::__cxx11::string::~string((string *)&rev_parse_out.Line1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindTopDir()
{
  std::string top_dir = this->SourceDirectory;

  // Run "git rev-parse --show-cdup" to locate the top of the tree.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = { git, "rev-parse", "--show-cdup", nullptr };
  std::string cdup;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", cdup);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err, nullptr,
                     cmProcessOutput::UTF8) &&
      !cdup.empty()) {
    top_dir += "/";
    top_dir += cdup;
    top_dir = cmSystemTools::CollapseFullPath(top_dir);
  }
  return top_dir;
}